

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_stack_overflow(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint __fd;
  void *pvVar4;
  ssize_t sVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  undefined8 *__n;
  undefined8 uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  void *__s2;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint uVar15;
  undefined8 *puVar16;
  int *unaff_R12;
  undefined8 *puVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  uint *__seed;
  bson_t b;
  undefined1 auStack_12bc [12];
  undefined8 *puStack_12b0;
  undefined8 *puStack_12a8;
  undefined8 *puStack_12a0;
  undefined8 *puStack_1298;
  uint *puStack_1290;
  code *pcStack_1288;
  undefined8 *puStack_1208;
  undefined8 *puStack_1200;
  undefined8 *puStack_11f8;
  int iStack_11ec;
  undefined8 *puStack_11e8;
  void *pvStack_11e0;
  undefined8 *puStack_11d8;
  long lStack_11d0;
  uint uStack_11c4;
  char acStack_11c0 [32];
  char acStack_11a0 [32];
  undefined8 uStack_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 uStack_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 auStack_10b8 [648];
  undefined8 *puStack_e30;
  int *piStack_e28;
  code *apcStack_e08 [16];
  int iStack_d84;
  int aiStack_d80 [52];
  undefined1 auStack_cb0 [648];
  char *pcStack_a28;
  code *apcStack_a08 [16];
  long alStack_988 [47];
  char *pcStack_810;
  code *apcStack_808 [16];
  long alStack_788 [47];
  void *pvStack_610;
  code *pcStack_608;
  undefined1 auStack_600 [368];
  void *pvStack_490;
  code *pcStack_488;
  undefined1 auStack_480 [368];
  void *pvStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [368];
  void *pvStack_190;
  code *pcStack_188;
  undefined1 auStack_180 [360];
  
  pcStack_188 = (code *)0x12db0c;
  pvVar4 = (void *)bson_malloc0(0x1100000);
  pcStack_188 = (code *)0x12db1f;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/stackoverflow.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_188 = (code *)0x12db9b;
    test_bson_as_json_stack_overflow_cold_5();
LAB_0012db9b:
    pcStack_188 = (code *)0x12dba0;
    test_bson_as_json_stack_overflow_cold_1();
LAB_0012dba0:
    pcStack_188 = (code *)0x12dba5;
    test_bson_as_json_stack_overflow_cold_2();
LAB_0012dba5:
    pcStack_188 = (code *)0x12dbaa;
    test_bson_as_json_stack_overflow_cold_4();
  }
  else {
    pcStack_188 = (code *)0x12db33;
    sVar5 = read(iVar2,pvVar4,0x1100000);
    if (sVar5 != 0x1000004) goto LAB_0012db9b;
    pcStack_188 = (code *)0x12db4b;
    cVar1 = bson_init_static(auStack_180,pvVar4,0x1000004);
    if (cVar1 == '\0') goto LAB_0012dba0;
    pcStack_188 = (code *)0x12db59;
    pcVar6 = (char *)bson_as_json(auStack_180);
    if (pcVar6 == (char *)0x0) goto LAB_0012dba5;
    pcStack_188 = (code *)0x12db70;
    pcVar7 = strstr(pcVar6,"...");
    if (pcVar7 != (char *)0x0) {
      pcStack_188 = (code *)0x12db7d;
      bson_free(pcVar6);
      pcStack_188 = (code *)0x12db85;
      bson_destroy(auStack_180);
      pcStack_188 = (code *)0x12db8d;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_188 = test_bson_corrupt;
  test_bson_as_json_stack_overflow_cold_3();
  pcStack_308 = (code *)0x12dbc9;
  pvStack_190 = pvVar4;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_308 = (code *)0x12dbdc;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test55.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_308 = (code *)0x12dc35;
    test_bson_corrupt_cold_4();
LAB_0012dc35:
    pcStack_308 = (code *)0x12dc3a;
    test_bson_corrupt_cold_1();
LAB_0012dc3a:
    pcStack_308 = (code *)0x12dc3f;
    test_bson_corrupt_cold_2();
  }
  else {
    pcStack_308 = (code *)0x12dbf0;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x18) goto LAB_0012dc35;
    pcStack_308 = (code *)0x12dc06;
    cVar1 = bson_init_static(auStack_300,pvVar4,0x18);
    if (cVar1 == '\0') goto LAB_0012dc3a;
    pcStack_308 = (code *)0x12dc14;
    lVar8 = bson_as_json(auStack_300);
    if (lVar8 == 0) {
      pcStack_308 = (code *)0x12dc21;
      bson_destroy(auStack_300);
      pcStack_308 = (code *)0x12dc29;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_308 = test_bson_corrupt_utf8;
  test_bson_corrupt_cold_3();
  pcStack_488 = (code *)0x12dc5e;
  pvStack_310 = pvVar4;
  pcStack_308 = (code *)&pcStack_188;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_488 = (code *)0x12dc71;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test56.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_488 = (code *)0x12dcca;
    test_bson_corrupt_utf8_cold_4();
LAB_0012dcca:
    pcStack_488 = (code *)0x12dccf;
    test_bson_corrupt_utf8_cold_1();
LAB_0012dccf:
    pcStack_488 = (code *)0x12dcd4;
    test_bson_corrupt_utf8_cold_2();
  }
  else {
    pcStack_488 = (code *)0x12dc85;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x2a) goto LAB_0012dcca;
    pcStack_488 = (code *)0x12dc9b;
    cVar1 = bson_init_static(auStack_480,pvVar4,0x2a);
    if (cVar1 == '\0') goto LAB_0012dccf;
    pcStack_488 = (code *)0x12dca9;
    lVar8 = bson_as_json(auStack_480);
    if (lVar8 == 0) {
      pcStack_488 = (code *)0x12dcb6;
      bson_destroy(auStack_480);
      pcStack_488 = (code *)0x12dcbe;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_488 = test_bson_corrupt_binary;
  test_bson_corrupt_utf8_cold_3();
  pcStack_608 = (code *)0x12dcf3;
  pvStack_490 = pvVar4;
  pcStack_488 = (code *)&pcStack_308;
  pvVar4 = (void *)bson_malloc0(0x400);
  pcStack_608 = (code *)0x12dd06;
  iVar2 = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test57.bson"
               ,0);
  if (iVar2 == -1) {
    pcStack_608 = (code *)0x12dd5f;
    test_bson_corrupt_binary_cold_4();
LAB_0012dd5f:
    pcStack_608 = (code *)0x12dd64;
    test_bson_corrupt_binary_cold_1();
LAB_0012dd64:
    pcStack_608 = (code *)0x12dd69;
    test_bson_corrupt_binary_cold_2();
  }
  else {
    pcStack_608 = (code *)0x12dd1a;
    sVar5 = read(iVar2,pvVar4,0x400);
    if (sVar5 != 0x1a) goto LAB_0012dd5f;
    pcStack_608 = (code *)0x12dd30;
    cVar1 = bson_init_static(auStack_600,pvVar4,0x1a);
    if (cVar1 == '\0') goto LAB_0012dd64;
    pcStack_608 = (code *)0x12dd3e;
    lVar8 = bson_as_json(auStack_600,0);
    if (lVar8 == 0) {
      pcStack_608 = (code *)0x12dd4b;
      bson_destroy(auStack_600);
      pcStack_608 = (code *)0x12dd53;
      bson_free(pvVar4);
      return;
    }
  }
  pcStack_608 = test_bson_as_json_spacing;
  test_bson_corrupt_binary_cold_3();
  alStack_788[0xf] = 0;
  alStack_788[0x10] = 0;
  alStack_788[0xd] = 0;
  alStack_788[0xe] = 0;
  alStack_788[0xb] = 0;
  alStack_788[0xc] = 0;
  alStack_788[9] = 0;
  alStack_788[10] = 0;
  alStack_788[7] = 0;
  alStack_788[8] = 0;
  alStack_788[5] = 0;
  alStack_788[6] = 0;
  alStack_788[3] = 0;
  alStack_788[4] = 0;
  alStack_788[1] = 0x500000003;
  alStack_788[2] = 5;
  apcStack_808[0] = (code *)0x12ddc3;
  pvStack_610 = pvVar4;
  pcStack_608 = (code *)&pcStack_488;
  pcVar6 = (char *)bson_as_json(alStack_788 + 1,alStack_788);
  apcStack_808[0] = (code *)0x12ddd5;
  iVar2 = strcmp(pcVar6,"{ }");
  if (iVar2 == 0) {
    if (alStack_788[0] != 3) goto LAB_0012de56;
    apcStack_808[0] = (code *)0x12dde9;
    bson_free(pcVar6);
    apcStack_808[0] = (code *)0x12de0a;
    bson_append_int32(alStack_788 + 1,"a",1,1);
    apcStack_808[0] = (code *)0x12de17;
    pcVar6 = (char *)bson_as_json(alStack_788 + 1,alStack_788);
    apcStack_808[0] = (code *)0x12de29;
    iVar2 = strcmp(pcVar6,"{ \"a\" : 1 }");
    if (iVar2 != 0) goto LAB_0012de5b;
    if (alStack_788[0] == 0xb) {
      apcStack_808[0] = (code *)0x12de3d;
      bson_free(pcVar6);
      apcStack_808[0] = (code *)0x12de4a;
      bson_destroy(alStack_788 + 1);
      return;
    }
  }
  else {
    apcStack_808[0] = (code *)0x12de56;
    test_bson_as_json_spacing_cold_1();
LAB_0012de56:
    apcStack_808[0] = (code *)0x12de5b;
    test_bson_as_json_spacing_cold_2();
LAB_0012de5b:
    apcStack_808[0] = (code *)0x12de60;
    test_bson_as_json_spacing_cold_3();
  }
  apcStack_808[0] = test_bson_array_as_json;
  test_bson_as_json_spacing_cold_4();
  alStack_988[0xf] = 0;
  alStack_988[0x10] = 0;
  alStack_988[0xd] = 0;
  alStack_988[0xe] = 0;
  alStack_988[0xb] = 0;
  alStack_988[0xc] = 0;
  alStack_988[9] = 0;
  alStack_988[10] = 0;
  alStack_988[7] = 0;
  alStack_988[8] = 0;
  alStack_988[5] = 0;
  alStack_988[6] = 0;
  alStack_988[3] = 0;
  alStack_988[4] = 0;
  alStack_988[1] = 0x500000003;
  alStack_988[2] = 5;
  apcStack_a08[0] = (code *)0x12deba;
  pcStack_810 = pcVar6;
  apcStack_808[0] = (code *)&pcStack_608;
  pcVar6 = (char *)bson_array_as_json(alStack_988 + 1,alStack_988);
  apcStack_a08[0] = (code *)0x12decc;
  iVar2 = strcmp(pcVar6,"[ ]");
  if (iVar2 == 0) {
    if (alStack_988[0] != 3) goto LAB_0012df4d;
    apcStack_a08[0] = (code *)0x12dee0;
    bson_free(pcVar6);
    apcStack_a08[0] = (code *)0x12df01;
    bson_append_int32(alStack_988 + 1,"0",1,1);
    apcStack_a08[0] = (code *)0x12df0e;
    pcVar6 = (char *)bson_array_as_json(alStack_988 + 1,alStack_988);
    apcStack_a08[0] = (code *)0x12df20;
    iVar2 = strcmp(pcVar6,"[ 1 ]");
    if (iVar2 != 0) goto LAB_0012df52;
    if (alStack_988[0] == 5) {
      apcStack_a08[0] = (code *)0x12df34;
      bson_free(pcVar6);
      apcStack_a08[0] = (code *)0x12df41;
      bson_destroy(alStack_988 + 1);
      return;
    }
  }
  else {
    apcStack_a08[0] = (code *)0x12df4d;
    test_bson_array_as_json_cold_1();
LAB_0012df4d:
    apcStack_a08[0] = (code *)0x12df52;
    test_bson_array_as_json_cold_2();
LAB_0012df52:
    apcStack_a08[0] = (code *)0x12df57;
    test_bson_array_as_json_cold_3();
  }
  apcStack_a08[0] = test_bson_json_allow_multiple;
  test_bson_array_as_json_cold_4();
  aiStack_d80[0x1c] = 0;
  aiStack_d80[0x1d] = 0;
  aiStack_d80[0x1e] = 0;
  aiStack_d80[0x1f] = 0;
  aiStack_d80[0x18] = 0;
  aiStack_d80[0x19] = 0;
  aiStack_d80[0x1a] = 0;
  aiStack_d80[0x1b] = 0;
  aiStack_d80[0x14] = 0;
  aiStack_d80[0x15] = 0;
  aiStack_d80[0x16] = 0;
  aiStack_d80[0x17] = 0;
  aiStack_d80[0x10] = 0;
  aiStack_d80[0x11] = 0;
  aiStack_d80[0x12] = 0;
  aiStack_d80[0x13] = 0;
  aiStack_d80[0xc] = 0;
  aiStack_d80[0xd] = 0;
  aiStack_d80[0xe] = 0;
  aiStack_d80[0xf] = 0;
  aiStack_d80[8] = 0;
  aiStack_d80[9] = 0;
  aiStack_d80[10] = 0;
  aiStack_d80[0xb] = 0;
  aiStack_d80[4] = 0;
  aiStack_d80[5] = 0;
  aiStack_d80[6] = 0;
  aiStack_d80[7] = 0;
  aiStack_d80[0] = 3;
  aiStack_d80[1] = 5;
  aiStack_d80[2] = 5;
  aiStack_d80[3] = 0;
  apcStack_e08[0] = (code *)0x12dfef;
  pcStack_a28 = pcVar6;
  apcStack_a08[0] = (code *)apcStack_808;
  __n = (undefined8 *)
        bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_e08[0] = (code *)0x12e007;
  lVar8 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (__n == (undefined8 *)0x0) {
    apcStack_e08[0] = (code *)0x12e294;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e294:
    apcStack_e08[0] = (code *)0x12e299;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e299:
    apcStack_e08[0] = (code *)0x12e2b1;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e2b1:
    apcStack_e08[0] = (code *)0x12e2b6;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e2b6:
    apcStack_e08[0] = (code *)0x12e2ce;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e2ce:
    apcStack_e08[0] = (code *)0x12e2d3;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e2d3:
    apcStack_e08[0] = (code *)0x12e2eb;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e2eb:
    apcStack_e08[0] = (code *)0x12e2f0;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e2f0:
    apcStack_e08[0] = (code *)0x12e308;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e308:
    apcStack_e08[0] = (code *)0x12e30d;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e30d:
    apcStack_e08[0] = (code *)0x12e325;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e325:
    apcStack_e08[0] = (code *)0x12e32a;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    if (lVar8 == 0) goto LAB_0012e294;
    apcStack_e08[0] = (code *)0x12e034;
    iVar2 = bson_json_reader_read(__n,aiStack_d80,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e299;
    apcStack_e08[0] = (code *)0x12e042;
    uVar9 = bson_bcone_magic();
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e06e;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e2b1;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e08b;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e09e;
    iVar2 = bson_json_reader_read(__n,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e2b6;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e0d0;
    bcon_extract(aiStack_d80,"b",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e2ce;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e0ed;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e100;
    iVar2 = bson_json_reader_read(__n,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e2d3;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e132;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e2eb;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e14f;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e162;
    iVar2 = bson_json_reader_read(lVar8,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e2f0;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e194;
    bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e308;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e1b1;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e1c4;
    iVar2 = bson_json_reader_read(lVar8,unaff_R12,auStack_cb0);
    if (iVar2 != 1) goto LAB_0012e30d;
    unaff_R12 = &iStack_d84;
    apcStack_e08[0] = (code *)0x12e1f6;
    bcon_extract(aiStack_d80,"b",uVar9,0xf,unaff_R12,0);
    if (iStack_d84 != 1) goto LAB_0012e325;
    unaff_R12 = aiStack_d80;
    apcStack_e08[0] = (code *)0x12e213;
    bson_reinit(unaff_R12);
    apcStack_e08[0] = (code *)0x12e226;
    iVar2 = bson_json_reader_read(lVar8,unaff_R12,auStack_cb0);
    if (iVar2 == 1) {
      unaff_R12 = &iStack_d84;
      apcStack_e08[0] = (code *)0x12e258;
      bcon_extract(aiStack_d80,"a",uVar9,0xf,unaff_R12,0);
      if (iStack_d84 == 1) {
        apcStack_e08[0] = (code *)0x12e26d;
        bson_json_reader_destroy(__n);
        apcStack_e08[0] = (code *)0x12e275;
        bson_json_reader_destroy(lVar8);
        apcStack_e08[0] = (code *)0x12e282;
        bson_destroy(aiStack_d80);
        return;
      }
      goto LAB_0012e342;
    }
  }
  apcStack_e08[0] = (code *)0x12e342;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e342:
  apcStack_e08[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  uStack_1110 = 0;
  uStack_1108 = 0;
  uStack_1120 = 0;
  uStack_1118 = 0;
  uStack_1130 = 0;
  uStack_1128 = 0;
  uStack_1140 = 0;
  uStack_1138 = 0;
  uStack_1150 = 0;
  uStack_1148 = 0;
  uStack_1160 = 0;
  uStack_1158 = 0;
  uStack_1170 = 0;
  uStack_1168 = 0;
  uStack_1180 = 0x500000003;
  uStack_1178 = 5;
  __seed = &uStack_11c4;
  uStack_11c4 = 0x2a;
  pcStack_1288 = (code *)0x12e3b0;
  puStack_e30 = __n;
  piStack_e28 = unaff_R12;
  apcStack_e08[0] = (code *)apcStack_a08;
  puStack_1200 = (undefined8 *)bson_string_new(0);
  puVar17 = (undefined8 *)0x1;
LAB_0012e3be:
  lStack_11d0 = (long)puVar17 * 8;
  iVar2 = 0;
  puStack_11d8 = puVar17;
LAB_0012e3d8:
  pcStack_1288 = (code *)0x12e3e4;
  iStack_11ec = iVar2;
  puVar10 = (undefined8 *)bson_malloc(lStack_11d0);
  puVar18 = (undefined8 *)0x0;
  puStack_1208 = puVar10;
  do {
    pcStack_1288 = (code *)0x12e3f4;
    uVar9 = bson_new();
    puVar10[(long)puVar18] = uVar9;
    pcStack_1288 = (code *)0x12e400;
    iVar2 = rand_r(__seed);
    if (0 < iVar2 % 5) {
      __n = (undefined8 *)0x0;
      do {
        uVar9 = puStack_1208[(long)puVar18];
        pcStack_1288 = (code *)0x12e439;
        iVar3 = rand_r(__seed);
        uVar14 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            acStack_11c0[uVar11] = (char)uVar11 + 'a';
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar14);
        }
        acStack_11c0[uVar14] = '\0';
        pcStack_1288 = (code *)0x12e480;
        iVar3 = rand_r(__seed);
        uVar14 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            acStack_11a0[uVar11] = (char)uVar11 + 'a';
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar14);
        }
        acStack_11a0[uVar14] = '\0';
        pcStack_1288 = (code *)0x12e4e2;
        bson_append_utf8(uVar9,acStack_11c0,0xffffffff,acStack_11a0,0xffffffff);
        uVar9 = puStack_1208[(long)puVar18];
        pcStack_1288 = (code *)0x12e4f3;
        iVar3 = rand_r(__seed);
        uVar14 = (long)iVar3 + ((ulong)(long)iVar3 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar14 != 0) {
          uVar11 = 0;
          do {
            acStack_11c0[uVar11] = (char)uVar11 + 'a';
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar14);
        }
        acStack_11c0[uVar14] = '\0';
        pcStack_1288 = (code *)0x12e53a;
        iVar3 = rand_r(__seed);
        pcStack_1288 = (code *)0x12e56f;
        bson_append_int32(uVar9,acStack_11c0,0xffffffff,
                          iVar3 + ((int)((long)iVar3 * 0x40000001 >> 0x3d) - (iVar3 >> 0x1f)) *
                                  -0x7fffffff);
        uVar15 = (int)__n + 1;
        __n = (undefined8 *)(ulong)uVar15;
      } while (uVar15 != iVar2 % 5);
    }
    puVar10 = puStack_1208;
    pcStack_1288 = (code *)0x12e58a;
    lVar8 = bson_as_json(puStack_1208[(long)puVar18],0);
    if (lVar8 == 0) goto LAB_0012e787;
    pcStack_1288 = (code *)0x12e5a6;
    bson_string_append(puStack_1200);
    pcStack_1288 = (code *)0x12e5ae;
    bson_free(lVar8);
    puVar17 = puStack_11d8;
    puVar18 = (undefined8 *)((long)puVar18 + 1);
  } while (puVar18 != puStack_11d8);
  pcStack_1288 = (code *)0x12e5ca;
  iVar2 = rand_r(__seed);
  pcStack_1288 = (code *)0x12e5f6;
  puVar18 = (undefined8 *)bson_json_data_reader_new(1,(ulong)(long)iVar2 % 100);
  pcStack_1288 = (code *)0x12e60f;
  bson_json_data_reader_ingest(puVar18,*puStack_1200,*(undefined4 *)(puStack_1200 + 1));
  puVar16 = (undefined8 *)0x0;
  while( true ) {
    __n = &uStack_1180;
    pcStack_1288 = (code *)0x12e629;
    puStack_11f8 = puVar16;
    bson_reinit(__n);
    pcStack_1288 = (code *)0x12e63c;
    iVar2 = bson_json_reader_read(puVar18,__n,auStack_10b8);
    if (iVar2 == -1) break;
    puVar19 = puVar10;
    if (iVar2 == 0) goto LAB_0012e8cc;
    pcStack_1288 = (code *)0x12e655;
    puStack_11e8 = (undefined8 *)bson_get_data(__n);
    __n = puStack_11f8;
    pcStack_1288 = (code *)0x12e66e;
    pvStack_11e0 = (void *)bson_get_data(puVar10[(long)puStack_11f8]);
    if (*(int *)(puVar10[(long)__n] + 4) != uStack_1180._4_4_) goto LAB_0012e78c;
    pcStack_1288 = (code *)0x12e68f;
    pvVar4 = (void *)bson_get_data();
    pcStack_1288 = (code *)0x12e69f;
    __s2 = (void *)bson_get_data(&uStack_1180);
    pcStack_1288 = (code *)0x12e6b1;
    iVar2 = bcmp(pvVar4,__s2,(ulong)*(uint *)(puVar10[(long)__n] + 4));
    puVar17 = puStack_11d8;
    if (iVar2 != 0) goto LAB_0012e78c;
    puVar16 = (undefined8 *)((long)__n + 1);
    __n = &uStack_1180;
    if (puStack_11d8 == puVar16) goto code_r0x0012e6d8;
  }
  pcStack_1288 = (code *)0x12e787;
  test_bson_json_read_buffering_cold_2();
LAB_0012e787:
  pcStack_1288 = (code *)0x12e78c;
  test_bson_json_read_buffering_cold_9();
LAB_0012e78c:
  __seed = (uint *)&uStack_1180;
  pcStack_1288 = (code *)0x12e79e;
  uVar9 = bson_as_canonical_extended_json(__seed,0);
  pcStack_1288 = (code *)0x12e7af;
  uVar12 = bson_as_canonical_extended_json(puVar10[(long)__n],0);
  puVar16 = puStack_11e8;
  uVar14 = 0xffffffff;
  if (uStack_1180._4_4_ == 0) goto LAB_0012e7f9;
  uVar11 = 0;
  goto LAB_0012e7e0;
  while( true ) {
    if (*(char *)((long)puStack_11e8 + uVar11) != *(char *)((long)pvStack_11e0 + uVar11)) {
      uVar14 = uVar11 & 0xffffffff;
      break;
    }
    uVar11 = uVar11 + 1;
    if (uStack_1180._4_4_ == (uint)uVar11) break;
LAB_0012e7e0:
    if (*(int *)(puVar10[(long)__n] + 4) == (int)uVar11) break;
  }
LAB_0012e7f9:
  if ((int)uVar14 == -1) {
    uVar15 = uStack_1180._4_4_;
    if (uStack_1180._4_4_ < *(uint *)(puStack_1208[(long)puStack_11f8] + 4)) {
      uVar15 = *(uint *)(puStack_1208[(long)puStack_11f8] + 4);
    }
    uVar14 = (ulong)(uVar15 - 1);
  }
  pcStack_1288 = (code *)0x12e839;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar9,uVar12);
  pcStack_1288 = (code *)0x12e851;
  uVar15 = open("failure.bad.bson",0x42,0x1a0);
  puVar19 = (undefined8 *)(ulong)uVar15;
  pcStack_1288 = (code *)0x12e86c;
  __fd = open("failure.expected.bson",0x42,0x1a0);
  __n = puVar16;
  puVar17 = puVar10;
  if (uVar15 == 0xffffffff) {
LAB_0012e8d1:
    pcStack_1288 = (code *)0x12e8d6;
    test_bson_json_read_buffering_cold_7();
LAB_0012e8d6:
    pcStack_1288 = (code *)0x12e8db;
    test_bson_json_read_buffering_cold_6();
LAB_0012e8db:
    pcStack_1288 = (code *)0x12e8e0;
    test_bson_json_read_buffering_cold_3();
  }
  else {
    __seed = (uint *)(ulong)__fd;
    if (__fd == 0xffffffff) goto LAB_0012e8d6;
    puVar17 = (undefined8 *)(uStack_1180 >> 0x20);
    pcStack_1288 = (code *)0x12e890;
    puVar10 = (undefined8 *)write(uVar15,puVar16,(size_t)puVar17);
    if (puVar10 != puVar17) goto LAB_0012e8db;
    __n = (undefined8 *)(ulong)*(uint *)(puStack_1208[(long)puStack_11f8] + 4);
    pcStack_1288 = (code *)0x12e8bc;
    puVar10 = (undefined8 *)write(__fd,pvStack_11e0,(size_t)__n);
    if (puVar10 == __n) {
      pcStack_1288 = (code *)0x12e8cc;
      test_bson_json_read_buffering_cold_5();
LAB_0012e8cc:
      pcStack_1288 = (code *)0x12e8d1;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012e8d1;
    }
  }
  pcStack_1288 = (code *)0x12e8e5;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012e8e5;
code_r0x0012e6d8:
  pcStack_1288 = (code *)0x12e6eb;
  iVar2 = bson_json_reader_read(puVar18,__n,auStack_10b8);
  if (iVar2 != 0) {
LAB_0012e8e5:
    pcStack_1288 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    puStack_12b0 = __n;
    puStack_12a8 = puVar17;
    puStack_12a0 = puVar18;
    puStack_1298 = puVar19;
    puStack_1290 = __seed;
    pcStack_1288 = (code *)apcStack_e08;
    bson_oid_init_from_string(auStack_12bc,"000000000000000000000000");
    uVar9 = bson_bcon_magic();
    uVar12 = bcon_new(0x1a9fbe77,0,"foo","bar","bar",uVar9,0xf,0x3035,"baz",uVar9,1,"map","{","a",
                      uVar9,0xf,1,"}","array","[",uVar9,0xf,1,uVar9,0xf,2,uVar9,0xf,3,uVar9,0xf,4,
                      "]","null",uVar9,9,"boolean",uVar9,7,1,"oid",uVar9,6,auStack_12bc,"binary",
                      uVar9,4,0,"deadbeef",8,"regex",uVar9,10,"foo|bar","ism","date",uVar9,8,10000,
                      "ref","{","$ref",uVar9,0,"foo","$id",uVar9,6,auStack_12bc);
    uVar13 = bcon_new(0,"after","b",0);
    iVar2 = 0x147e7e;
    uVar9 = bcon_new(0,"twice",uVar9,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar2,uVar12,uVar13,uVar9,0);
    return;
  }
  pcStack_1288 = (code *)0x12e6fb;
  bson_json_reader_destroy(puVar18);
  pcStack_1288 = (code *)0x12e70a;
  bson_string_truncate(puStack_1200);
  __n = (undefined8 *)0x0;
  do {
    pcStack_1288 = (code *)0x12e715;
    bson_destroy(puVar10[(long)__n]);
    __n = (undefined8 *)((long)__n + 1);
  } while (puVar17 != __n);
  pcStack_1288 = (code *)0x12e725;
  bson_free(puVar10);
  iVar2 = iStack_11ec + 1;
  if (iVar2 == 0x32) goto code_r0x0012e73f;
  goto LAB_0012e3d8;
code_r0x0012e73f:
  puVar17 = (undefined8 *)((long)puVar17 + 1);
  if (puVar17 == (undefined8 *)0xa) {
    pcStack_1288 = (code *)0x12e75e;
    bson_string_free(puStack_1200,1);
    pcStack_1288 = (code *)0x12e76b;
    bson_destroy(&uStack_1180);
    return;
  }
  goto LAB_0012e3be;
}

Assistant:

static void
test_bson_as_json_stack_overflow (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024 * 1024 * 17;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/stackoverflow.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 16777220);

   r = bson_init_static (&b, buf, 16777220);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (str);

   r = !!strstr (str, "...");
   BSON_ASSERT (r);

   bson_free (str);
   bson_destroy (&b);
   bson_free (buf);
}